

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void drop_nonterminal_imp_node
               (vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,
               vector<IsoTree,_std::allocator<IsoTree>_> *trees,
               vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  pointer pIVar2;
  pointer pIVar3;
  pointer pdVar4;
  pointer pIVar5;
  long lVar6;
  size_t tr;
  ulong uVar7;
  long lVar8;
  
  if (trees == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
    lVar8 = 0x48;
    lVar6 = 200;
    for (uVar7 = 0;
        pIVar5 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar7 < (ulong)(((long)(hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pIVar5) / 0xf8);
        uVar7 = uVar7 + 1) {
      pIVar3 = (imputer_tree->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pIVar5->col_num).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   + lVar6) == 0) {
        pvVar1 = (vector<double,_std::allocator<double>_> *)
                 ((long)&(pIVar3->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl + lVar8);
        pdVar4 = *(pointer *)
                  ((long)&(pIVar3->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl + lVar8);
        if (*(pointer *)
             ((long)&(pIVar3->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl +
             lVar8 + 8) != pdVar4) {
          (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = pdVar4;
        }
        std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(pvVar1);
      }
      else {
        shrink_impute_node((ImputeNode *)((long)pIVar3 + lVar8 + -0x48));
      }
      lVar8 = lVar8 + 0x68;
      lVar6 = lVar6 + 0xf8;
    }
  }
  else {
    lVar8 = 0x48;
    lVar6 = 0x38;
    for (uVar7 = 0;
        pIVar2 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_start,
        uVar7 < (ulong)(((long)(trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) / 0x70);
        uVar7 = uVar7 + 1) {
      pIVar3 = (imputer_tree->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (*(long *)((long)&pIVar2->col_type + lVar6) == 0) {
        pvVar1 = (vector<double,_std::allocator<double>_> *)
                 ((long)&(pIVar3->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl + lVar8);
        pdVar4 = *(pointer *)
                  ((long)&(pIVar3->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl + lVar8);
        if (*(pointer *)
             ((long)&(pIVar3->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl +
             lVar8 + 8) != pdVar4) {
          (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = pdVar4;
        }
        std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(pvVar1);
      }
      else {
        shrink_impute_node((ImputeNode *)((long)pIVar3 + lVar8 + -0x48));
      }
      lVar8 = lVar8 + 0x68;
      lVar6 = lVar6 + 0x70;
    }
  }
  std::vector<ImputeNode,_std::allocator<ImputeNode>_>::_M_shrink_to_fit(imputer_tree);
  return;
}

Assistant:

void drop_nonterminal_imp_node(std::vector<ImputeNode>  &imputer_tree,
                               std::vector<IsoTree>     *trees,
                               std::vector<IsoHPlane>   *hplanes)
{
    if (trees != NULL)
    {
        for (size_t tr = 0; tr < trees->size(); tr++)
        {
            if ((*trees)[tr].tree_left != 0)
            {
                shrink_impute_node(imputer_tree[tr]);
            }

            else
            {
                /* cat_weight is not needed for anything else */
                imputer_tree[tr].cat_weight.clear();
                imputer_tree[tr].cat_weight.shrink_to_fit();
            }
        }
    }

    else
    {
        for (size_t tr = 0; tr < hplanes->size(); tr++)
        {
            if ((*hplanes)[tr].hplane_left != 0)
            {
                shrink_impute_node(imputer_tree[tr]);
            }

            else
            {
                /* cat_weight is not needed for anything else */
                imputer_tree[tr].cat_weight.clear();
                imputer_tree[tr].cat_weight.shrink_to_fit();
            }
        }
    }

    imputer_tree.shrink_to_fit();
}